

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O1

void __thiscall temp_box::temp_box(temp_box *this,cf_face *face,cf_vertex_vec *verts)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  pointer pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  fvector3 edge [3];
  float afStack_98 [8];
  float local_78 [4];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  this->state = 0;
  pcVar6 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = 3;
  pfVar12 = local_78;
  do {
    lVar15 = lVar9;
    if (lVar9 == 3) {
      lVar15 = 0;
    }
    uVar4 = *(uint *)((long)&face->field_0 + lVar15 * 4);
    uVar5 = *(uint *)((long)face + lVar9 * 4 + -4);
    pfVar12[-2] = pcVar6[uVar4].p.field_0.field_0.x - pcVar6[uVar5].p.field_0.field_0.x;
    pfVar12[-1] = pcVar6[uVar4].p.field_0.field_0.y - pcVar6[uVar5].p.field_0.field_0.y;
    *pfVar12 = pcVar6[uVar4].p.field_0.field_0.z - pcVar6[uVar5].p.field_0.field_0.z;
    pfVar12 = pfVar12 + -3;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  puVar11 = (undefined1 *)((long)&face->field_0 + 0x10);
  uVar14 = 3;
  uVar13 = 4;
  lVar9 = 0x18;
  lVar15 = 0x24;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar14;
    if (lVar9 == -0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_sound_envs.cxx"
                    ,0x2f,"temp_box::temp_box(const cf_face &, const cf_vertex_vec &)");
    }
    lVar10 = lVar15 + (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) *
                      -9;
    fVar19 = *(float *)((long)afStack_98 + lVar9);
    fVar18 = *(float *)((long)afStack_98 + lVar9 + 4);
    fVar1 = *(float *)((long)afStack_98 + lVar10);
    fVar2 = *(float *)((long)afStack_98 + lVar10 + 4);
    fVar17 = *(float *)((long)afStack_98 + lVar9 + 8);
    fVar3 = *(float *)((long)afStack_98 + lVar10 + 8);
    fVar16 = (fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2) *
             (fVar17 * fVar17 + fVar19 * fVar19 + fVar18 * fVar18);
    if (fVar16 < 0.0) {
      local_48 = ZEXT416((uint)fVar17);
      local_58 = ZEXT416((uint)fVar18);
      local_68 = ZEXT416((uint)fVar19);
      fVar16 = sqrtf(fVar16);
      fVar17 = (float)local_48._0_4_;
      fVar18 = (float)local_58._0_4_;
      fVar19 = (float)local_68._0_4_;
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    uVar14 = uVar14 - 1;
    fVar16 = (fVar17 * fVar3 + fVar19 * fVar1 + fVar18 * fVar2) / fVar16;
    puVar11 = puVar11 + -4;
    uVar13 = uVar13 - 1;
    lVar9 = lVar9 + -0xc;
    lVar15 = lVar15 + -0xc;
  } while (0.001 <= (float)(~-(uint)(fVar16 < 0.0) & (uint)fVar16 |
                           (uint)(0.0 - fVar16) & -(uint)(fVar16 < 0.0)));
  (this->xform).field_0.field_0._11 = -fVar19;
  (this->xform).field_0.field_0._12 = -fVar18;
  (this->xform).field_0.field_0._13 = -fVar17;
  (this->xform).field_0.field_0._21 = fVar1;
  (this->xform).field_0.field_0._22 = fVar2;
  (this->xform).field_0.field_0._23 = fVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar13;
  uVar4 = *(uint *)(puVar11 +
                   (SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU) * -3);
  this->base_idx = uVar4;
  pcVar6 = (verts->super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>).
           _M_impl.super__Vector_impl_data._M_start;
  (this->xform).field_0.field_0._41 = pcVar6[uVar4].p.field_0.field_0.x;
  (this->xform).field_0.field_0._42 = pcVar6[uVar4].p.field_0.field_0.y;
  (this->xform).field_0.field_0._43 = pcVar6[uVar4].p.field_0.field_0.z;
  this->inner = *(uint16_t *)((long)&face->field_1 + 2);
  this->outer = *(ushort *)&face->field_1 & 0x3fff;
  return;
}

Assistant:

temp_box::temp_box(const cf_face& face, const cf_vertex_vec& verts): state(STATE_COLLECTING)
{
	fvector3 edge[3];
	for (uint_fast32_t i = 3; i != 0;) {
		--i;
		edge[i].sub(verts[face.v[(i+1)%3]].p, verts[face.v[i]].p);
	}
	for (uint_fast32_t i = 3; i != 0;) {
		uint_fast32_t j = i%3;
		if (equivalent(edge[--i].cosine(edge[j]), 0.f, k_zero_tolerance)) {
			xform.i.invert(edge[i]);
			xform.j.set(edge[j]);
			xform.c.set(verts[base_idx = face.v[j]].p);
			inner = face.sector;
			outer = face.material;
			return;
		}
	}
	xr_not_expected();
}